

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

message_order * __thiscall
FIX::DataDictionary::MessageFieldsOrderHolder::getMessageOrder(MessageFieldsOrderHolder *this)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  int *order;
  message_order mStack_48;
  
  if ((this->m_msgOrder).m_groupOrder.m_buffer == (int *)0x0) {
    piVar2 = (this->m_orderedFlds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->m_orderedFlds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar4 = (long)piVar3 - (long)piVar2 >> 2;
    order = (int *)operator_new__(-(ulong)(lVar4 + 1U >> 0x3e != 0) | lVar4 * 4 + 4U);
    for (lVar4 = 0; piVar1 = (pointer)((long)piVar2 + lVar4), piVar1 != piVar3; lVar4 = lVar4 + 4) {
      *(int *)((long)order + lVar4) = *piVar1;
    }
    *(undefined4 *)((long)order + lVar4) = 0;
    message_order::message_order(&mStack_48,order);
    message_order::operator=(&this->m_msgOrder,&mStack_48);
    shared_array<int>::~shared_array(&mStack_48.m_groupOrder);
    operator_delete__(order);
  }
  return &this->m_msgOrder;
}

Assistant:

const message_order &getMessageOrder() const {
      if (m_msgOrder) {
        return m_msgOrder;
      }

      int *tmp = new int[m_orderedFlds.size() + 1];
      int *i = tmp;

      for (OrderedFields::const_iterator iter = m_orderedFlds.begin(); iter != m_orderedFlds.end();
           *(i++) = *(iter++)) {}
      *i = 0;

      m_msgOrder = message_order(tmp);
      delete[] tmp;

      return m_msgOrder;
    }